

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathBooleanFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr ctxt_00;
  int iVar1;
  xmlXPathObjectPtr val;
  xmlXPathObjectPtr value;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueFrame < ctxt->valueNr) {
      val = valuePop(ctxt);
      if (val != (xmlXPathObjectPtr)0x0) {
        value = val;
        if (val->type != XPATH_BOOLEAN) {
          ctxt_00 = ctxt->context;
          iVar1 = xmlXPathCastToBoolean(val);
          value = xmlXPathCacheNewBoolean(ctxt_00,iVar1);
          xmlXPathReleaseObject(ctxt_00,val);
        }
        valuePush(ctxt,value);
        return;
      }
      iVar1 = 10;
    }
    else {
      iVar1 = 0x17;
    }
  }
  else {
    iVar1 = 0xc;
  }
  xmlXPathErr(ctxt,iVar1);
  return;
}

Assistant:

void
xmlXPathBooleanFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    CHECK_ARITY(1);
    cur = valuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    cur = xmlXPathCacheConvertBoolean(ctxt->context, cur);
    valuePush(ctxt, cur);
}